

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

bool __thiscall
libcellml::Validator::ValidatorImpl::checkIssuesForDuplications
          (ValidatorImpl *this,string *description)

{
  __type _Var1;
  element_type *this_00;
  Logger local_60;
  string local_50;
  ulong local_30;
  size_t i;
  size_t count;
  string *description_local;
  ValidatorImpl *this_local;
  
  count = (size_t)description;
  description_local = (string *)this;
  i = Logger::issueCount(&this->mValidator->super_Logger);
  local_30 = 0;
  while( true ) {
    if (i <= local_30) {
      return false;
    }
    Logger::issue(&local_60,(size_t)this->mValidator);
    this_00 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&local_60);
    Issue::description_abi_cxx11_(&local_50,this_00);
    _Var1 = std::operator==(&local_50,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            count);
    std::__cxx11::string::~string((string *)&local_50);
    std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)&local_60);
    if (_Var1) break;
    local_30 = local_30 + 1;
  }
  return true;
}

Assistant:

bool Validator::ValidatorImpl::checkIssuesForDuplications(const std::string &description) const
{
    size_t count = mValidator->issueCount();
    for (size_t i = 0; i < count; ++i) {
        if (mValidator->issue(count - 1 - i)->description() == description) {
            return true;
        }
    }
    return false;
}